

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
glcts::LayoutBindingBaseCase::makeSparseRange
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,LayoutBindingBaseCase *this,
          int maxElement,int minElement)

{
  float *pfVar1;
  vector<float,_std::allocator<float>_> rangeTemplate;
  int local_44;
  float local_40;
  float local_3c;
  float *local_38;
  float *local_30;
  long local_28;
  
  std::vector<float,std::allocator<float>>::vector<float_const*,void>
            ((vector<float,std::allocator<float>> *)&local_38,makeSparseRange::rangeT,
             (float *)&PTR_typeinfo_02184968,(allocator_type *)&local_44);
  local_3c = local_30[-1];
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_38 != local_30) {
    local_40 = (float)(~minElement + maxElement);
    pfVar1 = local_38;
    do {
      local_44 = (int)((*pfVar1 * local_40) / local_3c) + minElement;
      std::vector<int,_std::allocator<int>_>::_M_insert_rval
                (__return_storage_ptr__,
                 (const_iterator)
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,&local_44);
      pfVar1 = pfVar1 + 1;
    } while (pfVar1 != local_30);
  }
  if (local_38 != (float *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> makeSparseRange(int maxElement, int minElement = 0) const
	{
		static float	   rangeT[]		 = { 0.0f, 0.1f, 0.5f, 0.6f, 0.9f, 1.0f };
		std::vector<float> rangeTemplate = makeVector(rangeT);
		float			   max			 = rangeTemplate.back();
		float			   range		 = (float)((maxElement - 1) - minElement);

		std::vector<int> result;
		for (std::vector<float>::iterator it = rangeTemplate.begin(); it != rangeTemplate.end(); it++)
		{
			float e = *it;
			e		= (e * range) / max;
			result.insert(result.end(), minElement + (int)e);
		}
		return result;
	}